

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall Chainstate::PruneBlockIndexCandidates(Chainstate *this)

{
  pointer ppCVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  CBlockIndex *pb;
  _Self __tmp;
  const_iterator __position;
  long in_FS_OFFSET;
  CBlockIndexWorkComparator local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __position._M_node =
       (this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)__position._M_node !=
         &(this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header) {
    ppCVar1 = (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar1 ==
        (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pb = (CBlockIndex *)0x0;
    }
    else {
      pb = ppCVar1[-1];
    }
    bVar2 = ::node::CBlockIndexWorkComparator::operator()
                      (&local_39,*(CBlockIndex **)(__position._M_node + 1),pb);
    if (!bVar2) break;
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    std::
    _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
    ::erase_abi_cxx11_((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
                        *)&this->setBlockIndexCandidates,__position);
    __position._M_node = p_Var3;
  }
  if ((this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    __assert_fail("!setBlockIndexCandidates.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0xcec,"void Chainstate::PruneBlockIndexCandidates()");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::PruneBlockIndexCandidates() {
    // Note that we can't delete the current block itself, as we may need to return to it later in case a
    // reorganization to a better block fails.
    std::set<CBlockIndex*, CBlockIndexWorkComparator>::iterator it = setBlockIndexCandidates.begin();
    while (it != setBlockIndexCandidates.end() && setBlockIndexCandidates.value_comp()(*it, m_chain.Tip())) {
        setBlockIndexCandidates.erase(it++);
    }
    // Either the current tip or a successor of it we're working towards is left in setBlockIndexCandidates.
    assert(!setBlockIndexCandidates.empty());
}